

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void adjuststack(luaL_Buffer *B)

{
  lua_State *L_00;
  size_t sVar1;
  size_t l;
  size_t toplen;
  int toget;
  lua_State *L;
  luaL_Buffer *B_local;
  
  if (1 < B->lvl) {
    L_00 = B->L;
    toplen._4_4_ = 1;
    l = lua_objlen(L_00,-1);
    do {
      sVar1 = lua_objlen(L_00,-(toplen._4_4_ + 1));
      if (((B->lvl - toplen._4_4_) + 1 < 10) && (l <= sVar1)) break;
      l = sVar1 + l;
      toplen._4_4_ = toplen._4_4_ + 1;
    } while (toplen._4_4_ < B->lvl);
    lua_concat(L_00,toplen._4_4_);
    B->lvl = (B->lvl - toplen._4_4_) + 1;
  }
  return;
}

Assistant:

static void adjuststack(luaL_Buffer*B){
if(B->lvl>1){
lua_State*L=B->L;
int toget=1;
size_t toplen=lua_strlen(L,-1);
do{
size_t l=lua_strlen(L,-(toget+1));
if(B->lvl-toget+1>=(20/2)||toplen>l){
toplen+=l;
toget++;
}
else break;
}while(toget<B->lvl);
lua_concat(L,toget);
B->lvl=B->lvl-toget+1;
}
}